

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O0

void __thiscall
Wasm::PolymorphicEmitInfo::Init(PolymorphicEmitInfo *this,uint32 count,ArenaAllocator *alloc)

{
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *this_00;
  EmitInfo *pEVar1;
  TrackAllocData local_48;
  ArenaAllocator *local_20;
  ArenaAllocator *alloc_local;
  PolymorphicEmitInfo *pPStack_10;
  uint32 count_local;
  PolymorphicEmitInfo *this_local;
  
  (this->field_1).infos = (EmitInfo *)0x0;
  alloc_local._4_4_ = count;
  if (1 < count) {
    local_20 = alloc;
    pPStack_10 = this;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_48,(type_info *)&EmitInfo::typeinfo,0,(ulong)count,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmByteCodeGenerator.cpp"
               ,0x8a6);
    this_00 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
              TrackAllocInfo(&alloc->
                              super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                             ,&local_48);
    pEVar1 = Memory::AllocateArray<Memory::ArenaAllocator,Wasm::EmitInfo,false>
                       ((Memory *)this_00,(ArenaAllocator *)Memory::ArenaAllocator::Alloc,0,
                        (ulong)alloc_local._4_4_);
    (this->field_1).infos = pEVar1;
  }
  this->count = alloc_local._4_4_;
  return;
}

Assistant:

void PolymorphicEmitInfo::Init(uint32 count, ArenaAllocator* alloc)
{
    infos = nullptr;
    if (count > 1)
    {
        infos = AnewArray(alloc, EmitInfo, count);
    }
    this->count = count;
}